

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O2

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,shared_ptr<nigel::AstTerm> *cExpr,
          int priority)

{
  map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
  *this_00;
  Type TVar1;
  int iVar2;
  AST_Parser *pAVar3;
  mapped_type *pmVar4;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_ptr<nigel::AstReturning,(__gnu_cxx::_Lock_policy)2> *this_01;
  int in_R8D;
  shared_ptr<nigel::AstReturning> sVar5;
  shared_ptr<nigel::AstExpr> clTerm;
  key_type local_84;
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  AST_Parser *local_38;
  
  local_80._16_8_ = CONCAT44(in_register_0000000c,priority);
  local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             *)(currLVal + 2);
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currLVal;
  local_38 = this;
  do {
    TVar1 = (((cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_AstReturning).super_AstExpr.type;
    if (TVar1 == term) {
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_68);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)(local_68._0_8_ + 0x58));
      if (in_R8D <= *pmVar4) goto LAB_0014fcc7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
LAB_0014fd27:
      std::__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10),
                 (__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2> *)cExpr);
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_80);
      __r = (__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)(local_80._0_8_ + 0x48)
      ;
    }
    else {
LAB_0014fcc7:
      local_84 = op_set;
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,&local_84);
      if (*pmVar4 == in_R8D) {
        AstExpr::as<nigel::AstTerm>((AstExpr *)local_80);
        pmVar4 = std::
                 map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                 ::operator[](this_00,(key_type *)(local_80._0_8_ + 0x58));
        iVar2 = *pmVar4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
        if (TVar1 == term) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
        }
        if (iVar2 == in_R8D) goto LAB_0014fd27;
      }
      else if (TVar1 == term) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      }
      if ((((cExpr->super___shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_AstReturning).super_AstExpr.type != returnStat) break;
      std::__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10),
                 (__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2> *)cExpr);
      AstExpr::as<nigel::AstReturnStatement>((AstExpr *)local_80);
      __r = (__shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2> *)(local_80._0_8_ + 0x30)
      ;
    }
    std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)cExpr,__r);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  } while( true );
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nigel::AstExpr,(__gnu_cxx::_Lock_policy)2> *)(local_40._M_pi + 0xb),
               (__shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_);
  }
  else {
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._16_8_ + 0x10))->_M_use_count ==
        0x12) {
      AstExpr::as<nigel::AstReturnStatement>((AstExpr *)local_80);
      this_01 = (__shared_ptr<nigel::AstReturning,(__gnu_cxx::_Lock_policy)2> *)
                (local_80._0_8_ + 0x30);
    }
    else {
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._16_8_ + 0x10))->_M_use_count
          != 2) goto LAB_0014fe08;
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_80);
      this_01 = (__shared_ptr<nigel::AstReturning,(__gnu_cxx::_Lock_policy)2> *)
                (local_80._0_8_ + 0x48);
    }
    std::__shared_ptr<nigel::AstReturning,(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,(__shared_ptr<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  }
LAB_0014fe08:
  pAVar3 = local_38;
  AstExpr::as<nigel::AstReturning>((AstExpr *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
  sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pAVar3;
  return (shared_ptr<nigel::AstReturning>)
         sVar5.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstTerm> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstExpr> clTerm = nullptr;//Should be a term or a return statement
		while( true )
		{//Split all possible (unatomic) expressions
			if( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
				( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
			{
				clTerm = currLVal;
				currLVal = currLVal->as<AstTerm>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::returnStat )
			{
				clTerm = currLVal;
				currLVal = currLVal->as<AstReturnStatement>()->expr;
			}
			else break;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			if( clTerm->type == AstExpr::Type::term )
				clTerm->as<AstTerm>()->rVal = cExpr;
			else if( clTerm->type == AstExpr::Type::returnStat )
				clTerm->as<AstReturnStatement>()->expr = cExpr;
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}